

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_32ce0a::Transaction::SetUp(Transaction *this)

{
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
  *this_00;
  TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)> *this_01;
  mock_database *this_02;
  Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> AStack_128;
  MatcherBase<unsigned_long> local_108;
  MatcherBase<pstore::address> local_f0;
  MatcherBase<bool> local_d8;
  MatcherBase<bool> local_c0;
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_a8;
  InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>
  local_40;
  
  this_02 = &this->db_;
  local_f0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::address>::
       GetVTable<testing::internal::MatcherBase<pstore::address>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00255668;
  local_108.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_long>::
       GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_108.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00255448;
  local_d8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<bool>::
       GetVTable<testing::internal::MatcherBase<bool>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002555c8;
  local_c0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<bool>::
       GetVTable<testing::internal::MatcherBase<bool>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_c0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002555c8;
  mock_database::gmock_get
            (&local_a8,this_02,(Matcher<pstore::address> *)&local_f0,
             (Matcher<unsigned_long> *)&local_108,(Matcher<bool> *)&local_d8,
             (Matcher<bool> *)&local_c0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            InternalExpectedAt(&local_a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,0x61,"db_","get (_, _, _, _)");
  local_40.method_ptr = (offset_in_mock_database_to_subr)mock_database::base_get;
  local_40._16_8_ = 0;
  local_40.obj_ptr = this_02;
  testing::Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>,void>
            ((Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)> *)
             &AStack_128,&local_40);
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillRepeatedly(this_00,&AStack_128);
  std::_Function_base::~_Function_base((_Function_base *)&AStack_128);
  std::
  _Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
  ::~_Tuple_impl(&local_a8.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                );
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_c0);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_d8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_108);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase(&local_f0);
  local_f0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_long>::
       GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00255448;
  local_108.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_int>::
       GetVTable<testing::internal::MatcherBase<unsigned_int>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_108.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002554e8;
  mock_database::gmock_allocate
            ((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)&local_a8,this_02,
             (Matcher<unsigned_long> *)&local_f0,(Matcher<unsigned_int> *)&local_108);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::
            InternalExpectedAt((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)&local_a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,99,"db_","allocate (_, _)");
  local_d8.vtable_ = (VTable *)mock_database::base_allocate;
  local_d8.buffer_.ptr = (void *)0x0;
  local_d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)this_02;
  testing::Action<pstore::address_(unsigned_long,_unsigned_int)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>,_void>
            ((Action<pstore::address_(unsigned_long,_unsigned_int)> *)&AStack_128,
             (InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>
              *)&local_d8);
  testing::internal::TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)>::WillRepeatedly
            (this_01,(Action<pstore::address_(unsigned_long,_unsigned_int)> *)&AStack_128);
  std::_Function_base::~_Function_base((_Function_base *)&AStack_128);
  std::_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_int>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_int>_> *
               )&local_a8.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_108);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_f0);
  return;
}

Assistant:

void Transaction::SetUp () {
        using ::testing::_;
        using ::testing::Invoke;

        // Pass the mocked calls through to their original implementations.
        // I'm simply using the mocking framework to observe that the
        // correct calls are made. The precise division of labor between
        // the database and transaction classes is enforced or determined here.
        EXPECT_CALL (db_, get (_, _, _, _))
            .WillRepeatedly (Invoke (&db_, &mock_database::base_get));
        EXPECT_CALL (db_, allocate (_, _))
            .WillRepeatedly (Invoke (&db_, &mock_database::base_allocate));
    }